

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
::get_codepoint(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
                *this)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (this->current == 0x75) {
    local_38 = 0x80000000c;
    uStack_30 = 4;
    uVar5 = 0;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
      uVar1 = *(undefined4 *)((long)&local_38 + lVar7);
      get(this);
      iVar2 = this->current;
      uVar3 = iVar2 - 0x30;
      if (9 < uVar3) {
        if (iVar2 - 0x41U < 6) {
          uVar3 = iVar2 - 0x37;
        }
        else {
          if (5 < iVar2 - 0x61U) {
            return -1;
          }
          uVar3 = iVar2 - 0x57;
        }
      }
      uVar5 = uVar5 + (uVar3 << ((byte)uVar1 & 0x1f));
    }
    if (uVar5 < 0x10000) {
      return uVar5;
    }
    pcVar4 = "0x0000 <= codepoint && codepoint <= 0xFFFF";
    uVar6 = 0x1d93;
  }
  else {
    pcVar4 = "current == \'u\'";
    uVar6 = 0x1d79;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp",
             uVar6,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

int get_codepoint()
    {
        // this function only makes sense after reading `\u`
        JSON_ASSERT(current == 'u');
        int codepoint = 0;

        const auto factors = { 12u, 8u, 4u, 0u };
        for (const auto factor : factors)
        {
            get();

            if (current >= '0' && current <= '9')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x30u) << factor);
            }
            else if (current >= 'A' && current <= 'F')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x37u) << factor);
            }
            else if (current >= 'a' && current <= 'f')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x57u) << factor);
            }
            else
            {
                return -1;
            }
        }

        JSON_ASSERT(0x0000 <= codepoint && codepoint <= 0xFFFF);
        return codepoint;
    }